

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

void __thiscall
Refal2::
CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::grow(CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,int newCapacity)

{
  CKeyDataPair *__dest;
  void *memory;
  int newCapacity_local;
  CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (this->capacity < newCapacity) {
    this->capacity = newCapacity;
    __dest = (CKeyDataPair *)operator_new((long)this->capacity * 0x30);
    memcpy(__dest,this->keyDataPairs,(long)this->size * 0x30);
    operator_delete(this->keyDataPairs);
    this->keyDataPairs = __dest;
    return;
  }
  __assert_fail("newCapacity > capacity",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Dictionary.h"
                ,0x95,
                "void Refal2::CDictionary<Refal2::CGlobalFunctionData>::grow(int) [Data = Refal2::CGlobalFunctionData, Key = std::basic_string<char>]"
               );
}

Assistant:

void CDictionary<Data, Key>::grow( int newCapacity )
{
	assert( newCapacity > capacity );
	capacity = newCapacity;
	void* memory = ::operator new( capacity * sizeof( CKeyDataPair ) );
	::memcpy( memory, keyDataPairs, size * sizeof( CKeyDataPair ) );
	::operator delete( keyDataPairs );
	keyDataPairs = static_cast<CKeyDataPair*>( memory );
}